

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O0

TestResult * __thiscall
JsonTest::TestResult::addFailure(TestResult *this,char *file,uint line,char *expr)

{
  reference pvVar1;
  deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_> *in_RCX;
  TestResult *in_RDI;
  PredicateContext *lastNode;
  uint nestingLevel;
  char *in_stack_00000038;
  uint in_stack_00000044;
  char *in_stack_00000048;
  TestResult *in_stack_00000050;
  PredicateContext *local_30;
  
  for (local_30 = (in_RDI->rootPredicateNode_).next_; local_30 != (PredicateContext *)0x0;
      local_30 = local_30->next_) {
    if (in_RDI->lastUsedPredicateId_ < local_30->id_) {
      in_RDI->lastUsedPredicateId_ = local_30->id_;
      addFailureInfo(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000038,
                     this._4_4_);
      pvVar1 = std::deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::back(in_RCX);
      local_30->failure_ = pvVar1;
    }
  }
  addFailureInfo(in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000038,this._4_4_)
  ;
  pvVar1 = std::deque<JsonTest::Failure,_std::allocator<JsonTest::Failure>_>::back(in_RCX);
  in_RDI->messageTarget_ = pvVar1;
  return in_RDI;
}

Assistant:

TestResult&
TestResult::addFailure(const char* file, unsigned int line, const char* expr) {
  /// Walks the PredicateContext stack adding them to failures_ if not already
  /// added.
  unsigned int nestingLevel = 0;
  PredicateContext* lastNode = rootPredicateNode_.next_;
  for (; lastNode != 0; lastNode = lastNode->next_) {
    if (lastNode->id_ > lastUsedPredicateId_) // new PredicateContext
    {
      lastUsedPredicateId_ = lastNode->id_;
      addFailureInfo(
          lastNode->file_, lastNode->line_, lastNode->expr_, nestingLevel);
      // Link the PredicateContext to the failure for message target when
      // popping the PredicateContext.
      lastNode->failure_ = &(failures_.back());
    }
    ++nestingLevel;
  }

  // Adds the failed assertion
  addFailureInfo(file, line, expr, nestingLevel);
  messageTarget_ = &(failures_.back());
  return *this;
}